

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O2

int __thiscall CVmFuncPtr::get_fnptr(CVmFuncPtr *this,vm_val_t *v)

{
  int iVar1;
  undefined8 in_RAX;
  pool_ofs_t entry_ofs;
  
  entry_ofs = (pool_ofs_t)((ulong)in_RAX >> 0x20);
  iVar1 = CVmPoolInMem::get_ofs(&G_code_pool_X,(char *)this->p_,&entry_ofs);
  if (iVar1 == 0) {
    entry_ofs = CVmDynamicFunc::get_obj_from_prefix(this->p_);
    if (entry_ofs == 0) {
      v->typ = VM_NIL;
      return 0;
    }
    v->typ = VM_OBJ;
  }
  else {
    v->typ = VM_FUNCPTR;
  }
  (v->val).ofs = entry_ofs;
  return 1;
}

Assistant:

int CVmFuncPtr::get_fnptr(VMG_ vm_val_t *v)
{
    /* 
     *   Try translating the method address to a code pool offset.  If that
     *   succeeds, it's a regular static function.  
     */
    pool_ofs_t entry_ofs;
    if (G_code_pool->get_ofs((const char *)p_, &entry_ofs))
    {
        /* it's a regular function call */
        v->set_fnptr(entry_ofs);
        return TRUE;
    }

    /* 
     *   It's not a static function pointer, so it must be a dynamic
     *   function.  A DynamicFunc stores a prefix header before the start of
     *   our method header, containing the DynamicFunc object ID.  Read the
     *   object ID, and return it as a VM_OBJ value.  
     */
    vm_obj_id_t obj = CVmDynamicFunc::get_obj_from_prefix(vmg_ p_);
    if (obj != VM_INVALID_OBJ)
    {
        v->set_obj(obj);
        return TRUE;
    }

    /* we couldn't find any valid object */
    v->set_nil();
    return FALSE;
}